

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

TopologicalOrdersImpl<std::monostate> * __thiscall
wasm::TopologicalOrdersImpl<std::monostate>::operator++(TopologicalOrdersImpl<std::monostate> *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  Selector *__x;
  fd_set *pfVar5;
  fd_set *__writefds;
  Index extraout_var;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  byte local_61;
  value_type local_44;
  _Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector> local_38;
  undefined1 local_28 [8];
  optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> next;
  TopologicalOrdersImpl<std::monostate> *this_local;
  
  next.super__Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>.
  _8_8_ = this;
  std::optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector>::optional
            ((optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> *)local_28);
  while( true ) {
    bVar1 = std::
            vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ::empty(&this->selectors);
    local_61 = 0;
    if (!bVar1) {
      pvVar2 = std::
               vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ::back(&this->selectors);
      local_38 = (_Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>)
                 Selector::advance(pvVar2,this);
      local_28 = (undefined1  [8])local_38._M_payload._0_8_;
      next.super__Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>
      ._M_payload._0_8_ = local_38._8_8_;
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_28);
      local_61 = bVar1 ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    std::
    vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
    ::pop_back(&this->selectors);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_28);
  if (bVar1) {
    sVar3 = std::
            vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ::size(&this->selectors);
    sVar4 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(this->graph);
    if (sVar4 <= sVar3) {
      __assert_fail("selectors.size() < graph.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                    ,0x90,
                    "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
                   );
    }
    __x = std::optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector>::operator*
                    ((optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> *)local_28);
    std::
    vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
    ::push_back(&this->selectors,__x);
    while( true ) {
      pfVar5 = (fd_set *)
               std::
               vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ::size(&this->selectors);
      __writefds = (fd_set *)
                   std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::size(this->graph);
      if (__writefds <= pfVar5) break;
      pvVar2 = std::
               vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ::back(&this->selectors);
      local_44.start = Selector::select(pvVar2,(int)this,__readfds,__writefds,in_R8,in_R9);
      local_44.count = extraout_var;
      std::
      vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ::push_back(&this->selectors,&local_44);
    }
  }
  else {
    bVar1 = std::
            vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ::empty(&this->selectors);
    if (!bVar1) {
      __assert_fail("selectors.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                    ,0x8b,
                    "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
                   );
    }
  }
  return this;
}

Assistant:

TopologicalOrdersImpl& operator++() {
    // Find the last selector that can be advanced, popping any that cannot.
    std::optional<Selector> next;
    while (!selectors.empty() && !(next = selectors.back().advance(*this))) {
      selectors.pop_back();
    }
    if (!next) {
      // No selector could be advanced, so we've seen every possible ordering.
      assert(selectors.empty());
      return *this;
    }
    // We've advanced the last selector on the stack, so initialize the
    // subsequent selectors.
    assert(selectors.size() < graph.size());
    selectors.push_back(*next);
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }

    return *this;
  }